

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O3

int __thiscall ImageInput::close(ImageInput *this,int __fd)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  pbVar1 = (this->buffer)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this->isp;
  if (pbVar2 == pbVar1) {
    (this->buffer)._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pbVar2 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (**(code **)(*(long *)pbVar1 + 8))();
    }
  }
  else {
    pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__basic_file<char>::is_open();
    if ((char)pbVar2 != '\0') {
      pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::ifstream::close();
    }
  }
  this->isp = (istream *)0x0;
  return (int)pbVar2;
}

Assistant:

virtual void close() {
        if (isp == buffer.get()) {
            buffer.reset();
        } else if (file.is_open()) {
            file.close();
        }
        isp = nullptr;
    }